

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O1

void __thiscall MxxReduce_ReduceVec_Test::~MxxReduce_ReduceVec_Test(MxxReduce_ReduceVec_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxReduce, ReduceVec) {
    mxx::comm c;
    int n = 13;
    std::vector<int> v(n);

    for (int i = 0; i < n; ++i) {
        v[i] = c.rank() + i;
    }

    int ranksum = (c.size() * (c.size()-1)) / 2;

    std::vector<int> w = mxx::reduce(v, c.size()/2, c);
    if (c.rank() == c.size()/2) {
        ASSERT_EQ(n, (int)w.size());
        for (int i = 0; i < n; ++i) {
            ASSERT_EQ(ranksum + i*c.size(), w[i]);
        }
    } else {
        ASSERT_EQ(0u, w.size());
    }
}